

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::listmaps(int sender)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  vector<char_*> files;
  vector<char> line;
  char local_69;
  vector<char_*> local_68;
  int local_4c;
  vector<char> local_48;
  
  local_68.buf = (char **)0x0;
  local_68.alen = 0;
  local_68.ulen = 0;
  local_48.buf = (char *)0x0;
  local_48.alen = 0;
  local_48.ulen = 0;
  local_4c = sender;
  listfiles(mappath,"ogz",&local_68);
  quicksort<char*,bool(*)(char*const&,char*const&)>
            (local_68.buf,local_68.buf + local_68.ulen,compareless<char*>);
  pcVar6 = "server map files:";
  if (local_68.ulen == 0) {
    pcVar6 = "server has no map files";
  }
  sendf(local_4c,1,"ris",0x23,pcVar6);
  for (iVar5 = 0; iVar1 = local_68.ulen, iVar5 < local_68.ulen; iVar5 = iVar5 + uVar7) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff;
    lVar3 = (long)iVar5;
    uVar4 = 0;
    do {
      if (uVar4 != 0) {
        local_69 = ' ';
        vector<char>::add(&local_48,&local_69);
      }
      pcVar6 = local_68.buf[lVar3];
      sVar2 = strlen(pcVar6);
      vector<char>::put(&local_48,pcVar6,(int)sVar2);
      uVar7 = uVar4 + 1;
    } while ((lVar3 + 1 < (long)local_68.ulen) &&
            (bVar8 = uVar4 < 4, lVar3 = lVar3 + 1, uVar4 = uVar7, bVar8));
    local_69 = '\0';
    vector<char>::add(&local_48,&local_69);
    sendf(local_4c,1,"ris",0x23,local_48.buf);
  }
  while (iVar1 != 0) {
    local_68.ulen = iVar1 + -1;
    lVar3 = (long)iVar1;
    iVar1 = local_68.ulen;
    if (local_68.buf[lVar3 + -1] != (char *)0x0) {
      operator_delete__(local_68.buf[lVar3 + -1]);
      iVar1 = local_68.ulen;
    }
  }
  local_48._8_8_ = local_48._8_8_ & 0xffffffff;
  if (local_48.buf != (char *)0x0) {
    local_68.ulen = iVar1;
    operator_delete__(local_48.buf);
  }
  local_68.ulen = 0;
  if (local_68.buf != (char **)0x0) {
    operator_delete__(local_68.buf);
  }
  return;
}

Assistant:

void listmaps(int sender)
    {
        vector<char *> files;
        vector<char> line;
        listfiles(mappath, "ogz", files);
        files.sort();
        sendf(sender, 1, "ris", N_SERVMSG, files.length() ? "server map files:" : "server has no map files");
        for(int i = 0; i < files.length();)
        {
            line.setsize(0);
            for(int j = 0; i < files.length() && j < 5; i++, j++)
            {
                if(j) line.add(' ');
                line.put(files[i], strlen(files[i]));
            }
            line.add(0);
            sendf(sender, 1, "ris", N_SERVMSG, line.getbuf());
        }
        files.deletearrays();
    }